

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O3

void __thiscall SSD1306::OledI2C::setPixel(OledI2C *this,OledPoint p)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  bVar5 = OledPixel::pixelInside(&this->super_OledPixel,p);
  if (bVar5) {
    uVar3 = p.m_y;
    uVar6 = uVar3 + 7;
    if (-1 < (long)p) {
      uVar6 = uVar3;
    }
    uVar4 = p.m_x;
    uVar7 = uVar4 + 0x1f;
    if (-1 < (int)uVar4) {
      uVar7 = uVar4;
    }
    iVar1 = ((int)uVar7 >> 5) + ((int)uVar6 >> 3) * 4;
    lVar8 = (long)(int)(uVar4 - (uVar7 & 0xffffffe0));
    bVar2 = (this->blocks_)._M_elems[iVar1].bytes_._M_elems[lVar8 + 1];
    if ((bVar2 >> (uVar3 & 7) & 1) == 0) {
      (this->blocks_)._M_elems[iVar1].bytes_._M_elems[lVar8 + 1] =
           (byte)(1 << ((byte)p.m_y & 7)) | bVar2;
      if ((this->blocks_)._M_elems[iVar1].dirty_ == false) {
        (this->blocks_)._M_elems[iVar1].dirty_ = true;
      }
    }
  }
  return;
}

Assistant:

void
SSD1306::OledI2C::setPixel(
    SSD1306::OledPoint p)
{
    if (not pixelInside(p))
    {
        return;
    }

    PixelOffset po{p};

    if ((blocks_[po.block].bytes_[po.byte] & (1 << po.bit)) == 0)
    {
        blocks_[po.block].bytes_[po.byte] |= (1 << po.bit);

        if (not blocks_[po.block].dirty_)
        {
            blocks_[po.block].dirty_ = true;
        }
    }
}